

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall cmComputeTargetDepends::CollectTargets(cmComputeTargetDepends *this)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  iterator __position;
  mapped_type *pmVar5;
  pointer ppcVar6;
  cmGeneratorTarget *ti;
  cmGeneratorTarget *local_50;
  pointer local_48;
  pointer local_40;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *local_38;
  
  local_40 = (this->GlobalGenerator->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_48 = (this->GlobalGenerator->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_40 != local_48) {
    local_38 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
               &this->Targets;
    do {
      ppcVar2 = ((*local_40)->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar6 = ((*local_40)->GeneratorTargets).
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar2;
          ppcVar6 = ppcVar6 + 1) {
        local_50 = *ppcVar6;
        ppcVar3 = (this->Targets).
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppcVar4 = (this->Targets).
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pmVar5 = std::
                 map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                 ::operator[](&this->TargetIndex,&local_50);
        *pmVar5 = (mapped_type)((ulong)((long)ppcVar3 - (long)ppcVar4) >> 3);
        __position._M_current =
             (this->Targets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Targets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
          _M_realloc_insert<cmGeneratorTarget_const*const&>(local_38,__position,&local_50);
        }
        else {
          *__position._M_current = local_50;
          pppcVar1 = &(this->Targets).
                      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      local_40 = local_40 + 1;
    } while (local_40 != local_48);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargets()
{
  // Collect all targets from all generators.
  std::vector<cmLocalGenerator*> const& lgens =
    this->GlobalGenerator->GetLocalGenerators();
  for (cmLocalGenerator* lgen : lgens) {
    const std::vector<cmGeneratorTarget*>& targets =
      lgen->GetGeneratorTargets();
    for (cmGeneratorTarget const* ti : targets) {
      int index = static_cast<int>(this->Targets.size());
      this->TargetIndex[ti] = index;
      this->Targets.push_back(ti);
    }
  }
}